

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O3

void __thiscall FMaskCVar::FMaskCVar(FMaskCVar *this,char *name,FIntCVar *realvar,DWORD bitval)

{
  uint32 *puVar1;
  uint uVar2;
  int iVar3;
  
  iVar3 = 0;
  FBaseCVar::FBaseCVar(&this->super_FBaseCVar,name,0,(_func_void_FBaseCVar_ptr *)0x0);
  (this->super_FBaseCVar)._vptr_FBaseCVar = (_func_int **)&PTR__FBaseCVar_0086c3e0;
  this->ValueVar = realvar;
  this->BitVal = bitval;
  puVar1 = &(this->super_FBaseCVar).Flags;
  *(byte *)puVar1 = (byte)*puVar1 & 0x7f;
  if (bitval != 0) {
    if ((bitval & 1) == 0) {
      iVar3 = 0;
      do {
        iVar3 = iVar3 + 1;
        uVar2 = bitval & 2;
        bitval = bitval >> 1;
      } while (uVar2 == 0);
    }
    this->BitNum = iVar3;
    return;
  }
  __assert_fail("bitval != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/c_cvars.cpp"
                ,0x4a3,"FMaskCVar::FMaskCVar(const char *, FIntCVar &, DWORD)");
}

Assistant:

FMaskCVar::FMaskCVar (const char *name, FIntCVar &realvar, DWORD bitval)
: FBaseCVar (name, 0, NULL),
ValueVar (realvar),
BitVal (bitval)
{
	int bit;

	Flags &= ~CVAR_ISDEFAULT;

	assert (bitval != 0);

	bit = 0;
	while ((bitval & 1) == 0)
	{
		++bit;
		bitval >>= 1;
	}
	BitNum = bit;
}